

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_0::clearColorReference
               (Surface *ref,float red,float green,float blue,float alpha)

{
  void *data;
  Vec4 local_48;
  PixelBufferAccess local_38;
  
  local_48.m_data[0] = 1.12104e-44;
  local_48.m_data[1] = 4.2039e-45;
  data = (void *)(ref->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (ref->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_38,(TextureFormat *)&local_48,ref->m_width,ref->m_height,1,data);
  local_48.m_data[1] = green;
  local_48.m_data[0] = red;
  local_48.m_data[3] = 1.0;
  local_48.m_data[2] = blue;
  tcu::clear(&local_38,&local_48);
  return;
}

Assistant:

void clearColorReference (tcu::Surface* ref, float red, float green, float blue, float alpha)
{
	tcu::clear(ref->getAccess(), tcu::Vec4(red, green, blue, alpha));
}